

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O0

string * __thiscall
libtorrent::save_resume_data_failed_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,save_resume_data_failed_alert *this)

{
  string local_a8;
  string local_88;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  save_resume_data_failed_alert *local_18;
  save_resume_data_failed_alert *this_local;
  
  local_18 = this;
  this_local = (save_resume_data_failed_alert *)__return_storage_ptr__;
  torrent_alert::message_abi_cxx11_(&local_58,&this->super_torrent_alert);
  std::operator+(&local_38,&local_58," resume data was not generated: ");
  boost::system::error_code::message_abi_cxx11_(&local_a8,&this->error);
  convert_from_native(&local_88,&local_a8);
  std::operator+(__return_storage_ptr__,&local_38,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

std::string save_resume_data_failed_alert::message() const
	{
		return torrent_alert::message() + " resume data was not generated: "
			+ convert_from_native(error.message());
	}